

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  char *local_28;
  char *font;
  char **argv_local;
  int argc_local;
  
  iVar1 = SDL_Init(0x21);
  if (iVar1 < 0) {
    uVar2 = SDL_GetError();
    SDL_Log("Unable to initialize SDL: %s",uVar2);
    argv_local._4_4_ = 0;
  }
  else {
    if (argc < 2) {
      local_28 = default_font;
    }
    else {
      local_28 = argv[1];
    }
    iVar1 = ui_init(title,local_28,0x32,0x19);
    if (iVar1 == 0) {
      argv_local._4_4_ = 1;
    }
    else {
      ui_effects.crt = true;
      game_run(eventpoll,draw);
      ui_quit();
      SDL_Quit();
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    if (SDL_Init(SDL_INIT_TIMER | SDL_INIT_VIDEO) < 0) {
        SDL_Log("Unable to initialize SDL: %s", SDL_GetError());
        return 0;
    }

    const char *font = argc > 1 ? argv[1] : default_font;

    if (!ui_init(title, font, UI_COLS, UI_ROWS))
        return 1;

    ui_effects.crt = true;

    game_run(eventpoll, draw);

    ui_quit();

    SDL_Quit();
    return 0;
}